

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O0

int verify_data(uint8_t *data_ptr,int magic,int size)

{
  int iVar1;
  uint uVar2;
  uint local_34;
  int val;
  int *lptr;
  int k;
  int i;
  int size_local;
  int magic_local;
  uint8_t *data_ptr_local;
  
  lptr._4_4_ = 0;
  while( true ) {
    if (size / 4 <= lptr._4_4_) {
      return 1;
    }
    iVar1 = lptr._4_4_ + 1;
    local_34 = iVar1 * iVar1 + iVar1 * -3 + magic + 1;
    if ((int)local_34 < 0) {
      local_34 = 0;
    }
    uVar2 = i4le(data_ptr + (lptr._4_4_ << 2));
    if (uVar2 != local_34) break;
    lptr._4_4_ = lptr._4_4_ + 1;
  }
  return 0;
}

Assistant:

static
int verify_data(const uint8_t* data_ptr, int magic, int size) {
	int i = 0;

	/* This is how the test data inside test files was generated;
	 * we are re-generating it here and we check if our re-generated
	 * test data is the same as in the test file. If this test is
	 * failing it's either because there's a bug in the test case,
	 * or the unpacked data is corrupted. */

	for(i = 0; i < size / 4; ++i) {
		const int k = i + 1;
		const signed int* lptr = (const signed int*) &data_ptr[i * 4];
		signed int val = k * k - 3 * k + (1 + magic);

		if(val < 0)
			val = 0;

		/* *lptr is a value inside unpacked test file, val is the
		 * value that should be in the unpacked test file. */

		if(i4le(lptr) != (uint32_t) val)
			return 0;
	}

	return 1;
}